

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O1

void fe::operations::
     applyOperationT<fe::operations::op_unpremultipliedAlpha,fe::PixelB8G8R8A8,fe::PixelR8G8B8A8>
               (op_unpremultipliedAlpha *op,PixelB8G8R8A8 *srcPixelFormat,
               PixelR8G8B8A8 *destPixelFormat,ImageData *src,ImageData *dest)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  byte *pbVar12;
  byte *pbVar13;
  
  bVar5 = check(src,dest);
  if ((bVar5) && (iVar2 = (dest->super_fe_image).h, iVar2 != 0)) {
    iVar3 = (dest->super_fe_image).w;
    pbVar13 = (dest->super_fe_image).data;
    pbVar12 = (src->super_fe_image).data;
    iVar11 = 0;
    iVar4 = iVar3;
    pbVar10 = pbVar12;
    pbVar9 = pbVar13;
    do {
      for (; iVar4 != 0; iVar4 = iVar4 + -1) {
        bVar7 = pbVar12[2];
        bVar6 = *pbVar12;
        bVar8 = pbVar12[1];
        bVar1 = pbVar12[3];
        if (bVar1 != 0) {
          bVar7 = (byte)(((uint)bVar7 * 0x100 - (uint)bVar7) / (uint)bVar1);
          bVar8 = (byte)(((uint)bVar8 * 0x100 - (uint)bVar8) / (uint)bVar1);
          bVar6 = (byte)(((uint)bVar6 * 0x100 - (uint)bVar6) / (uint)bVar1);
        }
        *pbVar13 = bVar7;
        pbVar13[1] = bVar8;
        pbVar13[2] = bVar6;
        pbVar13[3] = bVar1;
        pbVar13 = pbVar13 + (dest->super_fe_image).bytespp;
        pbVar12 = pbVar12 + (src->super_fe_image).bytespp;
      }
      pbVar12 = pbVar10 + (src->super_fe_image).pitch;
      pbVar13 = pbVar9 + (dest->super_fe_image).pitch;
      iVar11 = iVar11 + 1;
      iVar4 = iVar3;
      pbVar10 = pbVar12;
      pbVar9 = pbVar13;
    } while (iVar11 != iVar2);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }